

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkSort.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  char **lines;
  __ssize_t _Var2;
  FILE *__stream;
  FILE *pFVar3;
  __ssize_t _Var4;
  char *pcVar5;
  long lVar6;
  char *line1;
  char *line2;
  size_t length2;
  size_t length1;
  int pipes [4] [2];
  int p2;
  int p1;
  char *local_80;
  char *local_78;
  FILE *local_70;
  size_t local_68 [2];
  int local_58 [2];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  fileName = *argv;
  if (argc == 1) {
    lines = (char **)malloc(800);
    lVar6 = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_80 = (char *)0x0;
    _Var2 = getline((char **)local_58,(size_t *)&local_80,_stdin);
    if (_Var2 == -1) {
      free((void *)local_58);
    }
    else {
      lVar6 = 0;
      do {
        *(int (*) [2])(lines + lVar6) = local_58;
        lVar6 = lVar6 + 1;
        local_58[0] = 0;
        local_58[1] = 0;
        local_80 = (char *)0x0;
        _Var2 = getline((char **)local_58,(size_t *)&local_80,_stdin);
      } while (_Var2 != -1);
      free((void *)local_58);
      if (lVar6 == 1) {
        pcVar5 = *lines;
        fputs(pcVar5,_stdout);
        free(pcVar5);
        free(lines);
        goto LAB_00101463;
      }
    }
    iVar1 = pipe(local_58);
    if (iVar1 != -1) {
      iVar1 = pipe(&local_48);
      if (iVar1 != -1) {
        iVar1 = pipe(&local_50);
        if (iVar1 != -1) {
          iVar1 = pipe(&local_40);
          if (iVar1 != -1) {
            create_child_process(&local_58,&local_34,&local_38);
            close(local_58[0]);
            close(local_50);
            close(local_44);
            close(local_3c);
            write_to_child_process(&local_58,(int)lVar6,lines);
            close(local_58[1]);
            close(local_4c);
            wait_for_child_process(local_34,local_38);
            __stream = fdopen(local_48,"r");
            pFVar3 = fdopen(local_40,"r");
            local_80 = (char *)0x0;
            local_78 = (char *)0x0;
            local_68[1] = 0;
            local_68[0] = 0;
            _Var2 = getline(&local_80,local_68 + 1,__stream);
            local_70 = pFVar3;
            _Var4 = getline(&local_78,local_68,pFVar3);
            do {
              __s = local_78;
              pcVar5 = local_80;
              iVar1 = strcmp(local_80,local_78);
              if (iVar1 < 0) {
                fputs(pcVar5,_stdout);
                _Var2 = getline(&local_80,local_68 + 1,__stream);
              }
              else {
                fputs(__s,_stdout);
                _Var4 = getline(&local_78,local_68,local_70);
              }
            } while ((_Var2 != -1) && (_Var4 != -1));
            if (_Var2 != -1) {
              do {
                fputs(local_80,_stdout);
                _Var2 = getline(&local_80,local_68 + 1,__stream);
              } while (_Var2 != -1);
            }
            pFVar3 = local_70;
            if (_Var4 != -1) {
              do {
                fputs(local_78,_stdout);
                _Var2 = getline(&local_78,local_68,pFVar3);
              } while (_Var2 != -1);
            }
            free(local_80);
            free(local_78);
            fclose(__stream);
            fclose(pFVar3);
LAB_00101463:
            fprintf(_stderr,"%s Success\n",fileName);
            exit(0);
          }
        }
      }
    }
    pcVar5 = "%s ERROR: Pipe-Error\n";
  }
  else {
    pcVar5 = "USAGE:\t%s\n";
  }
  fprintf(_stderr,pcVar5,fileName);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	fileName = argv[0];

	int counter = 0;

	if (argc != 1)
	{
		USAGE();
	}

	char **readString = get_input(&counter);

	if (counter == 1)
	{
		fprintf(stdout, "%s", readString[0]);

		free(readString[0]);
		free(readString);

		SUCCESS_EXIT();
	}

	int pipes[4][2];

	if (pipe(pipes[PIPE_1_WRITE]) == -1 || pipe(pipes[PIPE_1_READ]) == -1 || pipe(pipes[PIPE_2_WRITE]) == -1 || pipe(pipes[PIPE_2_READ]) == -1)
	{
		ERROR_EXIT("Pipe-Error");
	}

	int p1, p2; //first child process

	create_child_process(pipes, &p1, &p2);

	close(pipes[PIPE_1_WRITE][READ]);
	close(pipes[PIPE_2_WRITE][READ]);
	close(pipes[PIPE_1_READ][WRITE]);
	close(pipes[PIPE_2_READ][WRITE]);

	write_to_child_process(pipes,counter, readString);

	close(pipes[PIPE_1_WRITE][WRITE]);
	close(pipes[PIPE_2_WRITE][WRITE]);

    wait_for_child_process(p1, p2);

	FILE *file1 = fdopen(pipes[PIPE_1_READ][READ], "r"); //opens pipe as file
	FILE *file2 = fdopen(pipes[PIPE_2_READ][READ], "r"); //opens pipe as file

	
	char *line1 = NULL;
	char *line2 = NULL;
	size_t length1 = 0;
	size_t length2 = 0;
	ssize_t ret1 = getline(&line1, &length1, file1);
	ssize_t ret2 = getline(&line2, &length2, file2);

	// fetch one line from both
	// compare
	// print smaller and fetch a new one from that one
	// repeat till out of lines
	do
	{
		if (strcmp(line1, line2) < 0)
		{
			fprintf(stdout, "%s", line1);
			ret1 = getline(&line1, &length1, file1);
		}
		else{
			fprintf(stdout, "%s", line2);
			ret2 = getline(&line2, &length2, file2);
		}

	} while (ret1 != -1 && ret2 != -1);

	// if lines remain print them all
	while(ret1 != -1){
		fprintf(stdout,"%s", line1);
				
		ret1 = getline(&line1, &length1, file1);
	}

	while(ret2 != -1){
		fprintf(stdout,"%s", line2);
				
		ret2 = getline(&line2, &length2, file2);
	}

	free(line1);
	free(line2);

	fclose(file1);
	fclose(file2);


	SUCCESS_EXIT();
}